

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_common_intrin.h
# Opt level: O2

void prepare_coeffs_12tap(InterpFilterParams *filter_params,int subpel_q4,__m128i *coeffs)

{
  int16_t *piVar1;
  undefined8 uVar2;
  int16_t *piVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  
  piVar3 = filter_params->filter_ptr;
  uVar6 = (ulong)((uint)filter_params->taps * (subpel_q4 & 0xfU));
  piVar1 = piVar3 + uVar6;
  uVar7 = *(undefined4 *)piVar1;
  uVar8 = *(undefined4 *)(piVar1 + 2);
  uVar4 = *(undefined4 *)(piVar1 + 4);
  uVar5 = *(undefined4 *)(piVar1 + 6);
  *(undefined4 *)*coeffs = uVar7;
  *(undefined4 *)((long)*coeffs + 4) = uVar7;
  *(undefined4 *)(*coeffs + 1) = uVar7;
  *(undefined4 *)((long)*coeffs + 0xc) = uVar7;
  *(undefined4 *)coeffs[1] = uVar8;
  *(undefined4 *)((long)coeffs[1] + 4) = uVar8;
  *(undefined4 *)(coeffs[1] + 1) = uVar8;
  *(undefined4 *)((long)coeffs[1] + 0xc) = uVar8;
  *(undefined4 *)coeffs[2] = uVar4;
  *(undefined4 *)((long)coeffs[2] + 4) = uVar4;
  *(undefined4 *)(coeffs[2] + 1) = uVar4;
  *(undefined4 *)((long)coeffs[2] + 0xc) = uVar4;
  *(undefined4 *)coeffs[3] = uVar5;
  *(undefined4 *)((long)coeffs[3] + 4) = uVar5;
  *(undefined4 *)(coeffs[3] + 1) = uVar5;
  *(undefined4 *)((long)coeffs[3] + 0xc) = uVar5;
  uVar2 = *(undefined8 *)(piVar3 + uVar6 + 8);
  uVar7 = (undefined4)uVar2;
  uVar8 = (undefined4)((ulong)uVar2 >> 0x20);
  *(undefined4 *)coeffs[4] = uVar7;
  *(undefined4 *)((long)coeffs[4] + 4) = uVar7;
  *(undefined4 *)(coeffs[4] + 1) = uVar7;
  *(undefined4 *)((long)coeffs[4] + 0xc) = uVar7;
  *(undefined4 *)coeffs[5] = uVar8;
  *(undefined4 *)((long)coeffs[5] + 4) = uVar8;
  *(undefined4 *)(coeffs[5] + 1) = uVar8;
  *(undefined4 *)((long)coeffs[5] + 0xc) = uVar8;
  return;
}

Assistant:

static inline void prepare_coeffs_12tap(const InterpFilterParams *filter_params,
                                        int subpel_q4,
                                        __m128i *coeffs /* [6] */) {
  const int16_t *const y_filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

  coeffs[0] = _mm_shuffle_epi32(coeffs_y, 0);    // coeffs 0 1 0 1 0 1 0 1
  coeffs[1] = _mm_shuffle_epi32(coeffs_y, 85);   // coeffs 2 3 2 3 2 3 2 3
  coeffs[2] = _mm_shuffle_epi32(coeffs_y, 170);  // coeffs 4 5 4 5 4 5 4 5
  coeffs[3] = _mm_shuffle_epi32(coeffs_y, 255);  // coeffs 6 7 6 7 6 7 6 7

  coeffs_y = _mm_loadl_epi64((__m128i *)(y_filter + 8));

  coeffs[4] = _mm_shuffle_epi32(coeffs_y, 0);  // coeffs 8 9 8 9 8 9 8 9
  coeffs[5] =
      _mm_shuffle_epi32(coeffs_y, 85);  // coeffs 10 11 10 11 10 11 10 11
}